

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

bool __thiscall
Assimp::X3DExporter::CheckAndExport_Light(X3DExporter *this,aiNode *pNode,size_t pTabLevel)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  aiMatrix4x4t<float> *paVar4;
  char *__s;
  aiColor3D *pValue;
  DeadlyImportError *this_00;
  float pValue_00;
  aiVector3t<float> aVar5;
  string local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  aiVector3t<float> local_3e8;
  allocator<char> local_3d9;
  string local_3d8;
  aiVector3t<float> local_3b8;
  allocator<char> local_3a9;
  string local_3a8;
  aiVector3t<float> local_388;
  allocator<char> local_379;
  string local_378;
  aiVector3D local_358;
  undefined1 local_348 [8];
  aiVector3D direction_1;
  undefined1 local_328 [8];
  aiVector3D location_1;
  aiVector3D attenuation_1;
  aiVector3t<float> local_2e8;
  allocator<char> local_2d9;
  string local_2d8;
  aiVector3t<float> local_2b8;
  allocator<char> local_2a9;
  string local_2a8;
  aiVector3D local_288;
  undefined1 local_278 [8];
  aiVector3D location;
  aiVector3D attenuation;
  aiVector3t<float> local_238;
  allocator<char> local_229;
  string local_228;
  aiVector3D local_208;
  undefined1 local_1f8 [8];
  aiVector3D direction;
  allocator<char> local_1d9;
  string local_1d8;
  aiVector3t<float> local_1b8;
  allocator<char> local_1a9;
  string local_1a8;
  undefined1 local_183;
  allocator<char> local_182;
  allocator<char> local_181;
  value_type local_180;
  undefined1 local_13b;
  allocator<char> local_13a;
  allocator<char> local_139;
  value_type local_138;
  aiMatrix4x4 local_f8;
  undefined1 auStack_b8 [8];
  aiMatrix4x4 trafo_mat;
  aiLight *light;
  long lStack_58;
  bool found;
  size_t idx_light;
  anon_class_16_2_65aab299 Vec3ToAttrList;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  size_t pTabLevel_local;
  aiNode *pNode_local;
  X3DExporter *this_local;
  
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)&Vec3ToAttrList.attr_list);
  Vec3ToAttrList.this = (X3DExporter *)&Vec3ToAttrList.attr_list;
  bVar2 = false;
  idx_light = (size_t)this;
  if ((pNode->mName).length == 0) {
    this_local._7_1_ = false;
  }
  else {
    lStack_58 = 0;
    while (this->mScene->mNumLights != 0) {
      bVar3 = aiString::operator==(&pNode->mName,&this->mScene->mLights[lStack_58]->mName);
      if (bVar3) {
        bVar2 = true;
        break;
      }
      lStack_58 = lStack_58 + 1;
    }
    if (bVar2) {
      trafo_mat._56_8_ = this->mScene->mLights[lStack_58];
      Matrix_GlobalToCurrent(&local_f8,this,pNode);
      paVar4 = aiMatrix4x4t<float>::Inverse(&local_f8);
      auStack_b8._0_4_ = paVar4->a1;
      auStack_b8._4_4_ = paVar4->a2;
      trafo_mat.a1 = paVar4->a3;
      trafo_mat.a2 = paVar4->a4;
      trafo_mat.a3 = paVar4->b1;
      trafo_mat.a4 = paVar4->b2;
      trafo_mat.b1 = paVar4->b3;
      trafo_mat.b2 = paVar4->b4;
      trafo_mat.b3 = paVar4->c1;
      trafo_mat.b4 = paVar4->c2;
      trafo_mat.c1 = paVar4->c3;
      trafo_mat.c2 = paVar4->c4;
      trafo_mat.c3 = paVar4->d1;
      trafo_mat.c4 = paVar4->d2;
      trafo_mat.d1 = paVar4->d3;
      trafo_mat.d2 = paVar4->d4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"DEF",&local_139);
      local_13b = 1;
      __s = aiString::C_Str((aiString *)trafo_mat._56_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138.Value,__s,&local_13a);
      local_13b = 0;
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
      push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                 *)&Vec3ToAttrList.attr_list,&local_138);
      SAttribute::~SAttribute(&local_138);
      std::allocator<char>::~allocator(&local_13a);
      std::allocator<char>::~allocator(&local_139);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,"global",&local_181);
      local_183 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180.Value,"true",&local_182);
      local_183 = 0;
      std::__cxx11::
      list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
      push_back((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                 *)&Vec3ToAttrList.attr_list,&local_180);
      SAttribute::~SAttribute(&local_180);
      std::allocator<char>::~allocator(&local_182);
      std::allocator<char>::~allocator(&local_181);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"ambientIntensity",&local_1a9);
      aiVector3t<float>::aiVector3t
                (&local_1b8,*(float *)(trafo_mat._56_8_ + 0x450),
                 *(float *)(trafo_mat._56_8_ + 0x454),*(float *)(trafo_mat._56_8_ + 0x458));
      pValue_00 = aiVector3t<float>::Length(&local_1b8);
      AttrHelper_FloatToAttrList
                (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&Vec3ToAttrList.attr_list,&local_1a8,pValue_00,0.0);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"color",&local_1d9);
      pValue = (aiColor3D *)(trafo_mat._56_8_ + 0x438);
      aiColor3D::aiColor3D((aiColor3D *)&direction.z,1.0,1.0,1.0);
      AttrHelper_Color3ToAttrList
                (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)&Vec3ToAttrList.attr_list,&local_1d8,pValue,(aiColor3D *)&direction.z);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
      iVar1 = *(int *)(trafo_mat._56_8_ + 0x404);
      if (iVar1 == 1) {
        aVar5 = ::operator*((aiMatrix4x4t<float> *)auStack_b8,
                            (aiVector3t<float> *)(trafo_mat._56_8_ + 0x414));
        local_208.z = aVar5.z;
        local_208._0_8_ = aVar5._0_8_;
        local_1f8 = (undefined1  [8])local_208._0_8_;
        direction.x = local_208.z;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"direction",&local_229);
        aiVector3t<float>::aiVector3t(&local_238,0.0,0.0,-1.0);
        CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&idx_light,&local_228,(aiVector3D *)local_1f8,
                   &local_238);
        std::__cxx11::string::~string((string *)&local_228);
        std::allocator<char>::~allocator(&local_229);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&attenuation.z,"DirectionalLight",
                   (allocator<char> *)((long)&attenuation.y + 3));
        NodeHelper_OpenNode(this,(string *)&attenuation.z,pTabLevel,true,
                            (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                             *)&Vec3ToAttrList.attr_list);
        std::__cxx11::string::~string((string *)&attenuation.z);
        std::allocator<char>::~allocator((allocator<char> *)((long)&attenuation.y + 3));
      }
      else if (iVar1 == 2) {
        aiVector3t<float>::aiVector3t
                  ((aiVector3t<float> *)&location.z,*(float *)(trafo_mat._56_8_ + 0x42c),
                   *(float *)(trafo_mat._56_8_ + 0x430),*(float *)(trafo_mat._56_8_ + 0x434));
        aVar5 = ::operator*((aiMatrix4x4t<float> *)auStack_b8,
                            (aiVector3t<float> *)(trafo_mat._56_8_ + 0x408));
        local_288.z = aVar5.z;
        local_288._0_8_ = aVar5._0_8_;
        local_278 = (undefined1  [8])local_288._0_8_;
        location.x = local_288.z;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a8,"attenuation",&local_2a9);
        aiVector3t<float>::aiVector3t(&local_2b8,1.0,0.0,0.0);
        CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&idx_light,&local_2a8,(aiVector3D *)&location.z,
                   &local_2b8);
        std::__cxx11::string::~string((string *)&local_2a8);
        std::allocator<char>::~allocator(&local_2a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2d8,"location",&local_2d9);
        aiVector3t<float>::aiVector3t(&local_2e8,0.0,0.0,0.0);
        CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&idx_light,&local_2d8,(aiVector3D *)local_278,
                   &local_2e8);
        std::__cxx11::string::~string((string *)&local_2d8);
        std::allocator<char>::~allocator(&local_2d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&attenuation_1.z,"PointLight",
                   (allocator<char> *)((long)&attenuation_1.y + 3));
        NodeHelper_OpenNode(this,(string *)&attenuation_1.z,pTabLevel,true,
                            (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                             *)&Vec3ToAttrList.attr_list);
        std::__cxx11::string::~string((string *)&attenuation_1.z);
        std::allocator<char>::~allocator((allocator<char> *)((long)&attenuation_1.y + 3));
      }
      else {
        if (iVar1 != 3) {
          this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          to_string<aiLightSourceType>(&local_4a0,*(aiLightSourceType *)(trafo_mat._56_8_ + 0x404));
          std::operator+(&local_480,"Unknown light type: ",&local_4a0);
          DeadlyImportError::DeadlyImportError(this_00,&local_480);
          __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        aiVector3t<float>::aiVector3t
                  ((aiVector3t<float> *)&location_1.z,*(float *)(trafo_mat._56_8_ + 0x42c),
                   *(float *)(trafo_mat._56_8_ + 0x430),*(float *)(trafo_mat._56_8_ + 0x434));
        aVar5 = ::operator*((aiMatrix4x4t<float> *)auStack_b8,
                            (aiVector3t<float> *)(trafo_mat._56_8_ + 0x408));
        location_1.x = aVar5.z;
        unique0x100003f7 = aVar5._0_8_;
        local_328 = (undefined1  [8])unique0x100003f7;
        aVar5 = ::operator*((aiMatrix4x4t<float> *)auStack_b8,
                            (aiVector3t<float> *)(trafo_mat._56_8_ + 0x414));
        local_358.z = aVar5.z;
        local_358._0_8_ = aVar5._0_8_;
        local_348 = (undefined1  [8])local_358._0_8_;
        direction_1.x = local_358.z;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_378,"attenuation",&local_379);
        aiVector3t<float>::aiVector3t(&local_388,1.0,0.0,0.0);
        CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&idx_light,&local_378,(aiVector3D *)&location_1.z,
                   &local_388);
        std::__cxx11::string::~string((string *)&local_378);
        std::allocator<char>::~allocator(&local_379);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3a8,"location",&local_3a9);
        aiVector3t<float>::aiVector3t(&local_3b8,0.0,0.0,0.0);
        CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&idx_light,&local_3a8,(aiVector3D *)local_328,
                   &local_3b8);
        std::__cxx11::string::~string((string *)&local_3a8);
        std::allocator<char>::~allocator(&local_3a9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3d8,"direction",&local_3d9);
        aiVector3t<float>::aiVector3t(&local_3e8,0.0,0.0,-1.0);
        CheckAndExport_Light::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&idx_light,&local_3d8,(aiVector3D *)local_348,
                   &local_3e8);
        std::__cxx11::string::~string((string *)&local_3d8);
        std::allocator<char>::~allocator(&local_3d9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_408,"beamWidth",&local_409);
        AttrHelper_FloatToAttrList
                  (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&Vec3ToAttrList.attr_list,&local_408,*(float *)(trafo_mat._56_8_ + 0x45c)
                   ,0.7854);
        std::__cxx11::string::~string((string *)&local_408);
        std::allocator<char>::~allocator(&local_409);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_430,"cutOffAngle",&local_431);
        AttrHelper_FloatToAttrList
                  (this,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&Vec3ToAttrList.attr_list,&local_430,*(float *)(trafo_mat._56_8_ + 0x460)
                   ,1.570796);
        std::__cxx11::string::~string((string *)&local_430);
        std::allocator<char>::~allocator(&local_431);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_458,"SpotLight",&local_459);
        NodeHelper_OpenNode(this,&local_458,pTabLevel,true,
                            (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                             *)&Vec3ToAttrList.attr_list);
        std::__cxx11::string::~string((string *)&local_458);
        std::allocator<char>::~allocator(&local_459);
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  std::__cxx11::
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::~list
            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              *)&Vec3ToAttrList.attr_list);
  return this_local._7_1_;
}

Assistant:

bool X3DExporter::CheckAndExport_Light(const aiNode& pNode, const size_t pTabLevel)
{
list<SAttribute> attr_list;

auto Vec3ToAttrList = [&](const string& pAttrName, const aiVector3D& pAttrValue, const aiVector3D& pAttrDefaultValue)
{
	string tstr;

	if(pAttrValue != pAttrDefaultValue)
	{
		AttrHelper_Vec3DArrToString(&pAttrValue, 1, tstr);
		attr_list.push_back({pAttrName, tstr});
	}
};

size_t idx_light;
bool found = false;

	// Name of the light source can not be empty.
	if(pNode.mName.length == 0) return false;

	// search for light with name like node has.
	for(idx_light = 0; mScene->mNumLights; idx_light++)
	{
		if(pNode.mName == mScene->mLights[idx_light]->mName)
		{
			found = true;
			break;
		}
	}

	if(!found) return false;

	// Light source is found.
	const aiLight& light = *mScene->mLights[idx_light];// Alias for conveniance.

	aiMatrix4x4 trafo_mat = Matrix_GlobalToCurrent(pNode).Inverse();

	attr_list.push_back({"DEF", light.mName.C_Str()});
	attr_list.push_back({"global", "true"});// "false" is not supported.
	// ambientIntensity="0" SFFloat [inputOutput]
	AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", aiVector3D(light.mColorAmbient.r, light.mColorAmbient.g, light.mColorAmbient.b).Length(), 0);
	// color="1 1 1"        SFColor [inputOutput]
	AttrHelper_Color3ToAttrList(attr_list, "color", light.mColorDiffuse, aiColor3D(1, 1, 1));

	switch(light.mType)
	{
		case aiLightSource_DIRECTIONAL:
			{
				aiVector3D direction = trafo_mat * light.mDirection;

				Vec3ToAttrList("direction", direction, aiVector3D(0, 0, -1));
				NodeHelper_OpenNode("DirectionalLight", pTabLevel, true, attr_list);
			}

			break;
		case aiLightSource_POINT:
			{
				aiVector3D attenuation(light.mAttenuationConstant, light.mAttenuationLinear, light.mAttenuationQuadratic);
				aiVector3D location = trafo_mat * light.mPosition;

				Vec3ToAttrList("attenuation", attenuation, aiVector3D(1, 0, 0));
				Vec3ToAttrList("location", location, aiVector3D(0, 0, 0));
				NodeHelper_OpenNode("PointLight", pTabLevel, true, attr_list);
			}

			break;
		case aiLightSource_SPOT:
			{
				aiVector3D attenuation(light.mAttenuationConstant, light.mAttenuationLinear, light.mAttenuationQuadratic);
				aiVector3D location = trafo_mat * light.mPosition;
				aiVector3D direction = trafo_mat * light.mDirection;

				Vec3ToAttrList("attenuation", attenuation, aiVector3D(1, 0, 0));
				Vec3ToAttrList("location", location, aiVector3D(0, 0, 0));
				Vec3ToAttrList("direction", direction, aiVector3D(0, 0, -1));
				AttrHelper_FloatToAttrList(attr_list, "beamWidth", light.mAngleInnerCone, 0.7854f);
				AttrHelper_FloatToAttrList(attr_list, "cutOffAngle", light.mAngleOuterCone, 1.570796f);
				NodeHelper_OpenNode("SpotLight", pTabLevel, true, attr_list);
			}

			break;
		default:
			throw DeadlyExportError("Unknown light type: " + to_string(light.mType));
	}// switch(light.mType)

	return true;
}